

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::fastcgi::prepare_eof(fastcgi *this)

{
  uint16_t *puVar1;
  int iVar2;
  uint i;
  long lVar3;
  
  (this->eof_).record_.app_status = 0;
  (this->eof_).record_.protocol_status = '\0';
  (this->eof_).record_.reserved[0] = '\0';
  (this->eof_).record_.reserved[1] = '\0';
  (this->eof_).record_.reserved[2] = '\0';
  (this->eof_).headers_[0].version = '\0';
  (this->eof_).headers_[0].type = '\0';
  (this->eof_).headers_[0].request_id = 0;
  (this->eof_).headers_[0].content_length = 0;
  (this->eof_).headers_[0].padding_length = '\0';
  (this->eof_).headers_[0].reserved = '\0';
  (this->eof_).headers_[1].version = '\0';
  (this->eof_).headers_[1].type = '\0';
  (this->eof_).headers_[1].request_id = 0;
  (this->eof_).headers_[1].content_length = 0;
  (this->eof_).headers_[1].padding_length = '\0';
  (this->eof_).headers_[1].reserved = '\0';
  iVar2 = this->request_id_;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    (this->eof_).headers_[lVar3].version = '\x01';
    (this->eof_).headers_[lVar3].request_id = (uint16_t)iVar2;
  }
  (this->eof_).headers_[0].type = '\x06';
  (this->eof_).headers_[1].type = '\x03';
  (this->eof_).record_.protocol_status = '\0';
  puVar1 = &(this->eof_).headers_[0].request_id;
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  (this->eof_).headers_[0].content_length = 0;
  puVar1 = &(this->eof_).headers_[1].request_id;
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  (this->eof_).headers_[1].content_length = 0x800;
  (this->eof_).record_.app_status = 0;
  return;
}

Assistant:

void prepare_eof()
		{
			memset(&eof_,0,sizeof(eof_));
			for(unsigned i=0;i<2;i++) {
				eof_.headers_[i].version=fcgi_version_1;
				eof_.headers_[i].request_id=request_id_;
			}
			eof_.headers_[0].type=fcgi_stdout;
			eof_.headers_[1].type=fcgi_end_request;
			eof_.headers_[1].content_length=8;
			eof_.record_.protocol_status=fcgi_request_complete;
			eof_.headers_[0].to_net();
			eof_.headers_[1].to_net();
			eof_.record_.to_net();
		}